

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_writer.cpp
# Opt level: O1

void __thiscall VM_Writer::write_pop(VM_Writer *this,string *segment,int index)

{
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  long *plVar4;
  long *local_58;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  poVar3 = (ostream *)this->out_file;
  std::operator+(&local_38,"pop ",segment);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_48 = *plVar4;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar4;
    local_58 = (long *)*plVar2;
  }
  lVar1 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_58,lVar1);
  plVar2 = (long *)std::ostream::operator<<(poVar3,index);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void VM_Writer::write_pop(const std::string &segment, int index) {
    out_file << "pop " + segment + " " << index << std::endl;
}